

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSignal_POSIX.c
# Opt level: O1

UINT8 OSSignal_Signal(OS_SIGNAL *sig)

{
  UINT8 UVar1;
  int iVar2;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)sig);
  UVar1 = 0xff;
  if (iVar2 == 0) {
    sig->state = '\x01';
    pthread_cond_signal((pthread_cond_t *)&sig->hCond);
    iVar2 = pthread_mutex_unlock((pthread_mutex_t *)sig);
    UVar1 = -(iVar2 != 0);
  }
  return UVar1;
}

Assistant:

UINT8 OSSignal_Signal(OS_SIGNAL* sig)
{
	int retVal;
	
	retVal = pthread_mutex_lock(&sig->hMutex);
	if (retVal)
		return 0xFF;
	
	sig->state = 1;
	pthread_cond_signal(&sig->hCond);
	
	retVal = pthread_mutex_unlock(&sig->hMutex);
	return retVal ? 0xFF : 0x00;
}